

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O0

void __thiscall QEvdevKeyboardManager::addKeyboard(QEvdevKeyboardManager *this,QString *deviceNode)

{
  bool bVar1;
  undefined8 uVar2;
  QString *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_00000018;
  unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> keyboard;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  QEvdevKeyboardManager *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  QString *this_00;
  char local_68 [40];
  undefined8 local_40;
  char local_38 [32];
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcEvdevKey();
  anon_unknown.dwarf_106cc7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_106cc7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x135743);
    QMessageLogger::QMessageLogger
              (in_RDI,in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (char *)in_stack_ffffffffffffff68,(char *)0x135759);
    QtPrivate::asString(in_RSI);
    uVar2 = QString::utf16();
    QMessageLogger::debug(local_38,"Adding keyboard at %ls",uVar2);
    local_10 = 0;
  }
  local_40 = 0xaaaaaaaaaaaaaaaa;
  QEvdevKeyboardHandler::create((QString *)this,deviceNode,in_stack_00000018);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>
                      *)0x1357c0);
  if (bVar1) {
    in_stack_ffffffffffffff70 = (QEvdevKeyboardManager *)&in_RDI[1].context.file;
    this_00 = in_RSI;
    std::unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>::unique_ptr
              ((unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *)
               in_stack_ffffffffffffff70,
               (unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *)
               in_stack_ffffffffffffff68);
    QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::add
              ((DeviceHandlerList<QEvdevKeyboardHandler> *)this_00,(QString *)in_RDI,
               (unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *)
               in_RSI);
    std::unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>::~unique_ptr
              ((unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *)
               in_stack_ffffffffffffff70);
    updateDeviceCount(in_stack_ffffffffffffff70);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               (char *)in_stack_ffffffffffffff68);
    QtPrivate::asString(in_RSI);
    uVar2 = QString::utf16();
    QMessageLogger::warning(local_68,"Failed to open keyboard device %ls",uVar2);
  }
  std::unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>::~unique_ptr
            ((unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> *)
             in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevKeyboardManager::addKeyboard(const QString &deviceNode)
{
    qCDebug(qLcEvdevKey, "Adding keyboard at %ls", qUtf16Printable(deviceNode));
    auto keyboard = QEvdevKeyboardHandler::create(deviceNode, m_spec, m_defaultKeymapFile);
    if (keyboard) {
        m_keyboards.add(deviceNode, std::move(keyboard));
        updateDeviceCount();
    } else {
        qWarning("Failed to open keyboard device %ls", qUtf16Printable(deviceNode));
    }
}